

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t _elemsize;
  int *piVar3;
  Allocator *pAVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  size_t sVar11;
  void *pvVar12;
  Mat *pMVar13;
  void *pvVar14;
  int _woffset;
  int _hoffset;
  int _outc;
  Mat local_148;
  int _outw;
  Mat *local_f8;
  int _outd;
  int _outh;
  Mat m;
  int local_98;
  Mat m_1;
  long local_40;
  int _coffset;
  int _doffset;
  
  iVar7 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  iVar2 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  uVar9 = bottom_blob->dims - 1;
  if (3 < uVar9) {
    local_148.cstep = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elempack = 0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    goto LAB_001bb5e8;
  }
  lVar5 = (long)iVar7;
  lVar10 = (long)iVar8;
  local_148.w = iVar7;
  switch(uVar9) {
  case 0:
    local_148.cstep = bottom_blob->elempack * lVar5;
    local_148.elemsize._0_4_ = 4;
    local_148.elempack = 1;
    local_148.dims = 1;
    local_148.w = (int)local_148.cstep;
    local_148.h = 1;
    local_148.d = 1;
    local_148.c = 1;
    break;
  case 1:
    lVar10 = bottom_blob->elempack * lVar10;
    local_148.elemsize._0_4_ = 4;
    local_148.elempack = 1;
    local_148.dims = 2;
    local_148.h = (int)lVar10;
    local_148.d = 1;
    local_148.c = 1;
    local_148.cstep = lVar10 * lVar5;
    break;
  case 2:
    local_148.c = bottom_blob->elempack;
    local_148.dims = 3;
    local_148.d = 1;
    lVar10 = lVar10 * lVar5;
    goto LAB_001bb55c;
  case 3:
    local_148.c = bottom_blob->elempack;
    local_148.dims = 4;
    lVar10 = lVar10 * lVar5 * (long)iVar1;
    local_148.d = iVar1;
LAB_001bb55c:
    local_148.c = local_148.c * iVar2;
    local_148.elempack = 1;
    local_148.elemsize._0_4_ = 4;
    local_148.cstep = lVar10 + 3U & 0x3ffffffffffffffc;
    local_148.h = iVar8;
  }
LAB_001bb5e8:
  local_148.elemsize._4_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.refcount._0_4_ = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.data = (void *)0x0;
  local_f8 = top_blob;
  resolve_crop_roi(this,&local_148,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
                   &_outc);
  piVar3 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  pMVar13 = local_f8;
  switch(uVar9) {
  case 0:
    if (_outw != iVar7) {
      Mat::create(local_f8,_outw,_elemsize,opt->blob_allocator);
      if (pMVar13->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar13->c * pMVar13->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar13,0,_woffset);
        return 0;
      }
      if (_elemsize == 2) {
        copy_cut_border_image<unsigned_short>(bottom_blob,pMVar13,0,_woffset);
        return 0;
      }
      if (_elemsize == 1) {
        copy_cut_border_image<signed_char>(bottom_blob,pMVar13,0,_woffset);
        return 0;
      }
      return 0;
    }
    if (local_f8 == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = local_f8->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar12 = local_f8->data;
        pAVar4 = local_f8->allocator;
joined_r0x001bb7ce:
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar12 != (void *)0x0) {
            free(pvVar12);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    break;
  case 1:
    if (iVar8 != _outh || iVar7 != _outw) {
      Mat::create(local_f8,_outw,_outh,_elemsize,opt->blob_allocator);
      if (pMVar13->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar13->c * pMVar13->cstep == 0) {
        return -100;
      }
      if (_elemsize == 4) {
        copy_cut_border_image<float>(bottom_blob,pMVar13,_hoffset,_woffset);
        return 0;
      }
      if (_elemsize != 2) {
        if (_elemsize != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(bottom_blob,pMVar13,_hoffset,_woffset);
        return 0;
      }
      copy_cut_border_image<unsigned_short>(bottom_blob,pMVar13,_hoffset,_woffset);
      return 0;
    }
    if (local_f8 == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = local_f8->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar12 = local_f8->data;
        pAVar4 = local_f8->allocator;
        goto joined_r0x001bb7ce;
      }
    }
    break;
  case 2:
    if (_outc != iVar2 || (iVar8 != _outh || iVar7 != _outw)) {
      local_148.w = bottom_blob->w;
      local_148.h = bottom_blob->h;
      if (bottom_blob->dims == 3) {
        sVar11 = bottom_blob->elemsize;
        local_148.data =
             (void *)((long)_coffset * bottom_blob->cstep * sVar11 + (long)bottom_blob->data);
        local_148.elempack = bottom_blob->elempack;
        local_148.allocator = bottom_blob->allocator;
        local_148.elemsize._0_4_ = (undefined4)sVar11;
        local_148.elemsize._4_4_ = (undefined4)(sVar11 >> 0x20);
        local_148.dims = 3;
        local_148.d = 1;
        lVar5 = (long)local_148.h * (long)local_148.w * sVar11;
      }
      else {
        sVar11 = bottom_blob->elemsize;
        local_148.data =
             (void *)((long)_coffset * bottom_blob->cstep * sVar11 + (long)bottom_blob->data);
        local_148.d = bottom_blob->d;
        local_148.elempack = bottom_blob->elempack;
        local_148.allocator = bottom_blob->allocator;
        local_148.elemsize._0_4_ = (undefined4)sVar11;
        local_148.elemsize._4_4_ = (undefined4)(sVar11 >> 0x20);
        local_148.dims = 4;
        lVar5 = (long)local_148.h * (long)local_148.w * (long)local_148.d * sVar11;
      }
      local_148.refcount._4_4_ = 0;
      local_148.refcount._0_4_ = 0;
      local_148.cstep = (lVar5 + 0xfU & 0xfffffffffffffff0) / sVar11;
      if (iVar8 != _outh || iVar7 != _outw) {
        Mat::create(local_f8,_outw,_outh,_outc,_elemsize,opt->blob_allocator);
        iVar7 = -100;
        if ((pMVar13->data != (void *)0x0) && ((long)pMVar13->c * pMVar13->cstep != 0)) {
          if (0 < _outc) {
            lVar5 = 0;
            do {
              if (local_148.dims == 3) {
                lVar10 = local_148.cstep * lVar5 *
                         CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                m.dims = 2;
                m.c = 1;
              }
              else {
                lVar10 = local_148.cstep * lVar5 *
                         CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                m.dims = 3;
                m.c = local_148.d;
              }
              m.data = (void *)(lVar10 + (long)local_148.data);
              m.d = 1;
              m.w = local_148.w;
              m.allocator = local_148.allocator;
              m.elempack = local_148.elempack;
              m.elemsize._4_4_ = local_148.elemsize._4_4_;
              m.elemsize._0_4_ = (undefined4)local_148.elemsize;
              m.refcount._4_4_ = 0;
              m.refcount._0_4_ = 0;
              m.h = local_148.h;
              m.cstep = (long)local_148.h * (long)local_148.w;
              if (pMVar13->dims == 3) {
                uVar9 = pMVar13->w;
                sVar11 = pMVar13->elemsize;
                m_1.data = (void *)(pMVar13->cstep * lVar5 * sVar11 + (long)pMVar13->data);
                iVar7 = pMVar13->h;
                m_1.elempack = pMVar13->elempack;
                m_1.allocator = pMVar13->allocator;
                m_1.elemsize._0_4_ = (undefined4)sVar11;
                m_1.elemsize._4_4_ = (undefined4)(sVar11 >> 0x20);
                m_1.dims = 2;
                m_1.c = 1;
              }
              else {
                uVar9 = pMVar13->w;
                iVar7 = pMVar13->h;
                m_1.c = pMVar13->d;
                sVar11 = pMVar13->elemsize;
                m_1.data = (void *)(pMVar13->cstep * lVar5 * sVar11 + (long)pMVar13->data);
                m_1.elempack = pMVar13->elempack;
                m_1.allocator = pMVar13->allocator;
                m_1.elemsize._0_4_ = (undefined4)sVar11;
                m_1.elemsize._4_4_ = (undefined4)(sVar11 >> 0x20);
                m_1.dims = 3;
              }
              m_1.d = 1;
              m_1.refcount._4_4_ = 0;
              m_1.refcount._0_4_ = 0;
              m_1.cstep = (long)iVar7 * (long)(int)uVar9;
              m_1.h = iVar7;
              m_1.w = uVar9;
              if (_elemsize == 4) {
                m_1.d = 1;
                m_1.refcount._4_4_ = 0;
                m_1.refcount._0_4_ = 0;
                m.d = 1;
                m.refcount._4_4_ = 0;
                m.refcount._0_4_ = 0;
                copy_cut_border_image<float>(&m,&m_1,_hoffset,_woffset);
              }
              else if (_elemsize == 2) {
                m_1.d = 1;
                m_1.refcount._4_4_ = 0;
                m_1.refcount._0_4_ = 0;
                m.d = 1;
                m.refcount._4_4_ = 0;
                m.refcount._0_4_ = 0;
                copy_cut_border_image<unsigned_short>(&m,&m_1,_hoffset,_woffset);
              }
              else if ((_elemsize == 1) && (pMVar13 = local_f8, 0 < iVar7)) {
                lVar10 = (long)local_148.w;
                pvVar14 = (void *)((long)m.data +
                                  (long)_woffset +
                                  _hoffset * lVar10 *
                                  CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize))
                ;
                iVar8 = 0;
                pvVar12 = m_1.data;
                do {
                  if ((int)uVar9 < 0xc) {
                    if (0 < (int)uVar9) {
                      uVar6 = 0;
                      do {
                        *(undefined1 *)((long)pvVar12 + uVar6) =
                             *(undefined1 *)((long)pvVar14 + uVar6);
                        uVar6 = uVar6 + 1;
                      } while (uVar9 != uVar6);
                    }
                  }
                  else {
                    memcpy(pvVar12,pvVar14,(ulong)uVar9);
                  }
                  pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar9);
                  pvVar14 = (void *)((long)pvVar14 + lVar10);
                  iVar8 = iVar8 + 1;
                  pMVar13 = local_f8;
                } while (iVar8 != iVar7);
              }
              piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    if (m_1.data != (void *)0x0) {
                      free(m_1.data);
                    }
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              m_1.cstep = 0;
              m_1.data = (void *)0x0;
              m_1.refcount._0_4_ = 0;
              m_1.refcount._4_4_ = 0;
              m_1.elemsize._0_4_ = 0;
              m_1.elemsize._4_4_ = 0;
              m_1.elempack = 0;
              m_1.dims = 0;
              m_1.w = 0;
              m_1.h = 0;
              m_1.d = 0;
              m_1.c = 0;
              piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    if (m.data != (void *)0x0) {
                      free(m.data);
                    }
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              lVar5 = lVar5 + 1;
            } while (lVar5 < _outc);
          }
          iVar7 = 0;
        }
      }
      else {
        Mat::clone(&m,(__fn *)&local_148,(void *)0x0,_outc,(void *)(ulong)(uint)_outh);
        if (&m != pMVar13) {
          piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = pMVar13->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (pMVar13->allocator == (Allocator *)0x0) {
                if (pMVar13->data != (void *)0x0) {
                  free(pMVar13->data);
                }
              }
              else {
                (*pMVar13->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar13->cstep = 0;
          pMVar13->data = (void *)0x0;
          pMVar13->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
          pMVar13->dims = 0;
          pMVar13->w = 0;
          pMVar13->h = 0;
          pMVar13->d = 0;
          pMVar13->c = 0;
          pMVar13->data = m.data;
          pMVar13->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          pMVar13->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
          pMVar13->elempack = m.elempack;
          pMVar13->allocator = m.allocator;
          pMVar13->dims = m.dims;
          pMVar13->w = m.w;
          pMVar13->h = m.h;
          pMVar13->d = m.d;
          pMVar13->c = m.c;
          pMVar13->cstep = m.cstep;
        }
        piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (pMVar13->data == (void *)0x0) {
          iVar7 = -100;
        }
        else {
          iVar7 = -100;
          if ((long)pMVar13->c * pMVar13->cstep != 0) {
            iVar7 = 0;
          }
        }
      }
      piVar3 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      if (piVar3 == (int *)0x0) {
        return iVar7;
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 != 0) {
        return iVar7;
      }
      if (local_148.allocator != (Allocator *)0x0) {
        (*(local_148.allocator)->_vptr_Allocator[3])();
        return iVar7;
      }
joined_r0x001bc782:
      if (local_148.data != (void *)0x0) {
        local_148.allocator = (Allocator *)0x0;
        free(local_148.data);
        return iVar7;
      }
      return iVar7;
    }
    if (local_f8 == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = local_f8->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar12 = local_f8->data;
        pAVar4 = local_f8->allocator;
        goto joined_r0x001bb7ce;
      }
    }
    break;
  case 3:
    if (_outc != iVar2 || (iVar1 != _outd || (iVar8 != _outh || iVar7 != _outw))) {
      local_148.w = bottom_blob->w;
      local_148.h = bottom_blob->h;
      if (bottom_blob->dims == 3) {
        sVar11 = bottom_blob->elemsize;
        local_148.data =
             (void *)((long)_coffset * bottom_blob->cstep * sVar11 + (long)bottom_blob->data);
        local_148.elempack = bottom_blob->elempack;
        local_148.allocator = bottom_blob->allocator;
        local_148.elemsize._0_4_ = (undefined4)sVar11;
        local_148.elemsize._4_4_ = (undefined4)(sVar11 >> 0x20);
        local_148.dims = 3;
        local_148.d = 1;
        lVar5 = (long)local_148.h * (long)local_148.w * sVar11;
      }
      else {
        sVar11 = bottom_blob->elemsize;
        local_148.data =
             (void *)((long)_coffset * bottom_blob->cstep * sVar11 + (long)bottom_blob->data);
        local_148.d = bottom_blob->d;
        local_148.elempack = bottom_blob->elempack;
        local_148.allocator = bottom_blob->allocator;
        local_148.elemsize._0_4_ = (undefined4)sVar11;
        local_148.elemsize._4_4_ = (undefined4)(sVar11 >> 0x20);
        local_148.dims = 4;
        lVar5 = (long)local_148.h * (long)local_148.w * (long)local_148.d * sVar11;
      }
      local_148.refcount._4_4_ = 0;
      local_148.refcount._0_4_ = 0;
      local_148.cstep = (lVar5 + 0xfU & 0xfffffffffffffff0) / sVar11;
      if (iVar1 != _outd || (iVar8 != _outh || iVar7 != _outw)) {
        Mat::create(local_f8,_outw,_outh,_outd,_outc,_elemsize,opt->blob_allocator);
        iVar7 = -100;
        if ((pMVar13->data != (void *)0x0) && ((long)pMVar13->c * pMVar13->cstep != 0)) {
          if (0 < _outc) {
            local_40 = 0;
            do {
              if (0 < _outd) {
                lVar5 = 0;
                do {
                  local_98 = (int)lVar5;
                  m.cstep = (long)local_148.h * (long)local_148.w;
                  m.data = (void *)((long)local_148.data +
                                   ((long)local_98 + (long)_doffset) *
                                   CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize)
                                   * m.cstep +
                                   local_148.cstep * local_40 *
                                   CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize)
                                   );
                  m.refcount._0_4_ = 0;
                  m.refcount._4_4_ = 0;
                  m.elemsize._0_4_ = (undefined4)local_148.elemsize;
                  m.elemsize._4_4_ = local_148.elemsize._4_4_;
                  m.elempack = local_148.elempack;
                  m.allocator = local_148.allocator;
                  m.w = local_148.w;
                  m.dims = 2;
                  m.h = local_148.h;
                  m.d = 1;
                  m.c = 1;
                  sVar11 = pMVar13->elemsize;
                  m_1.elempack = pMVar13->elempack;
                  m_1.allocator = pMVar13->allocator;
                  iVar7 = pMVar13->h;
                  uVar9 = pMVar13->w;
                  m_1.cstep = (long)iVar7 * (long)(int)uVar9;
                  pvVar12 = (void *)((long)pMVar13->data +
                                    lVar5 * sVar11 * m_1.cstep + pMVar13->cstep * local_40 * sVar11)
                  ;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)sVar11;
                  m_1.elemsize._4_4_ = (undefined4)(sVar11 >> 0x20);
                  m_1.w = uVar9;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  m_1.data = pvVar12;
                  m_1.h = iVar7;
                  if (_elemsize == 4) {
                    m_1.c = 1;
                    m_1.d = 1;
                    m_1.refcount._4_4_ = 0;
                    m_1.refcount._0_4_ = 0;
                    m.c = 1;
                    m.d = 1;
                    m.refcount._4_4_ = 0;
                    m.refcount._0_4_ = 0;
                    copy_cut_border_image<float>(&m,&m_1,_hoffset,_woffset);
                  }
                  else if (_elemsize == 2) {
                    m_1.c = 1;
                    m_1.d = 1;
                    m_1.refcount._4_4_ = 0;
                    m_1.refcount._0_4_ = 0;
                    m.c = 1;
                    m.d = 1;
                    m.refcount._4_4_ = 0;
                    m.refcount._0_4_ = 0;
                    copy_cut_border_image<unsigned_short>(&m,&m_1,_hoffset,_woffset);
                  }
                  else if ((_elemsize == 1) && (pMVar13 = local_f8, 0 < iVar7)) {
                    lVar10 = (long)local_148.w;
                    pvVar14 = (void *)((long)m.data +
                                      (long)_woffset +
                                      _hoffset * lVar10 *
                                      CONCAT44(local_148.elemsize._4_4_,
                                               (undefined4)local_148.elemsize));
                    iVar8 = 0;
                    do {
                      if ((int)uVar9 < 0xc) {
                        if (0 < (int)uVar9) {
                          uVar6 = 0;
                          do {
                            *(undefined1 *)((long)pvVar12 + uVar6) =
                                 *(undefined1 *)((long)pvVar14 + uVar6);
                            uVar6 = uVar6 + 1;
                          } while (uVar9 != uVar6);
                        }
                      }
                      else {
                        memcpy(pvVar12,pvVar14,(ulong)uVar9);
                      }
                      pvVar12 = (void *)((long)pvVar12 + (long)(int)uVar9);
                      pvVar14 = (void *)((long)pvVar14 + lVar10);
                      iVar8 = iVar8 + 1;
                      pMVar13 = local_f8;
                    } while (iVar8 != iVar7);
                  }
                  piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        if (m.data != (void *)0x0) {
                          free(m.data);
                        }
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m.cstep = 0;
                  m.data = (void *)0x0;
                  m.refcount._0_4_ = 0;
                  m.refcount._4_4_ = 0;
                  m.elemsize._0_4_ = 0;
                  m.elemsize._4_4_ = 0;
                  m.elempack = 0;
                  m.dims = 0;
                  m.w = 0;
                  m.h = 0;
                  m.d = 0;
                  m.c = 0;
                  lVar5 = lVar5 + 1;
                } while (lVar5 < _outd);
              }
              local_40 = local_40 + 1;
            } while (local_40 < _outc);
          }
          iVar7 = 0;
        }
      }
      else {
        Mat::clone(&m,(__fn *)&local_148,(void *)0x0,_outd,(void *)(ulong)(uint)_outc);
        if (&m != pMVar13) {
          piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = pMVar13->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (pMVar13->allocator == (Allocator *)0x0) {
                if (pMVar13->data != (void *)0x0) {
                  free(pMVar13->data);
                }
              }
              else {
                (*pMVar13->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar13->cstep = 0;
          pMVar13->data = (void *)0x0;
          pMVar13->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
          pMVar13->dims = 0;
          pMVar13->w = 0;
          pMVar13->h = 0;
          pMVar13->d = 0;
          pMVar13->c = 0;
          pMVar13->data = m.data;
          pMVar13->refcount = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
          pMVar13->elemsize = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
          pMVar13->elempack = m.elempack;
          pMVar13->allocator = m.allocator;
          pMVar13->dims = m.dims;
          pMVar13->w = m.w;
          pMVar13->h = m.h;
          pMVar13->d = m.d;
          pMVar13->c = m.c;
          pMVar13->cstep = m.cstep;
        }
        piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (pMVar13->data == (void *)0x0) {
          iVar7 = -100;
        }
        else {
          iVar7 = -100;
          if ((long)pMVar13->c * pMVar13->cstep != 0) {
            iVar7 = 0;
          }
        }
      }
      piVar3 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      if (piVar3 == (int *)0x0) {
        return iVar7;
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 != 0) {
        return iVar7;
      }
      if (local_148.allocator != (Allocator *)0x0) {
        (*(local_148.allocator)->_vptr_Allocator[3])();
        return iVar7;
      }
      goto joined_r0x001bc782;
    }
    if (local_f8 == bottom_blob) {
      return 0;
    }
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = local_f8->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar12 = local_f8->data;
        pAVar4 = local_f8->allocator;
        goto joined_r0x001bb7ce;
      }
    }
    break;
  default:
    goto LAB_001bc528;
  }
  pMVar13->cstep = 0;
  pMVar13->data = (void *)0x0;
  pMVar13->refcount = (int *)0x0;
  *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
  *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
  pMVar13->dims = 0;
  pMVar13->w = 0;
  pMVar13->h = 0;
  pMVar13->d = 0;
  pMVar13->c = 0;
  piVar3 = bottom_blob->refcount;
  pMVar13->data = bottom_blob->data;
  pMVar13->refcount = piVar3;
  pMVar13->elemsize = bottom_blob->elemsize;
  pMVar13->elempack = bottom_blob->elempack;
  pMVar13->allocator = bottom_blob->allocator;
  iVar7 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  pMVar13->dims = bottom_blob->dims;
  pMVar13->w = iVar7;
  pMVar13->h = iVar8;
  pMVar13->d = iVar1;
  pMVar13->c = bottom_blob->c;
  pMVar13->cstep = bottom_blob->cstep;
LAB_001bc528:
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}